

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall despot::util::tinyxml::TiXmlNode::~TiXmlNode(TiXmlNode *this)

{
  TiXmlBase *pTVar1;
  TiXmlNode *pTVar2;
  
  (this->super_TiXmlBase)._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlNode_0019c450;
  pTVar2 = this->firstChild;
  while (pTVar2 != (TiXmlNode *)0x0) {
    pTVar1 = &pTVar2->super_TiXmlBase;
    pTVar2 = pTVar2->next;
    (*pTVar1->_vptr_TiXmlBase[1])();
  }
  TiXmlString::quit(&this->value);
  return;
}

Assistant:

TiXmlNode::~TiXmlNode() {
	TiXmlNode* node = firstChild;
	TiXmlNode* temp = 0;

	while (node) {
		temp = node;
		node = node->next;
		delete temp;
	}
}